

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_naive_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowNaiveAggregator::WindowNaiveAggregator
          (WindowNaiveAggregator *this,WindowAggregateExecutor *executor,
          WindowSharedExpressions *shared)

{
  BoundWindowExpression *pBVar1;
  pointer pBVar2;
  column_t in_RAX;
  pointer pBVar3;
  column_t local_38;
  
  local_38 = in_RAX;
  WindowAggregator::WindowAggregator
            (&this->super_WindowAggregator,(executor->super_WindowExecutor).wexpr,shared);
  (this->super_WindowAggregator)._vptr_WindowAggregator =
       (_func_int **)&PTR__WindowNaiveAggregator_027cae00;
  this->executor = executor;
  (this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pBVar1 = (this->super_WindowAggregator).wexpr;
  pBVar2 = (pBVar1->arg_orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pBVar3 = (pBVar1->arg_orders).
                super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                ._M_impl.super__Vector_impl_data._M_start; pBVar3 != pBVar2; pBVar3 = pBVar3 + 1) {
    local_38 = WindowSharedExpressions::RegisterCollection(shared,&pBVar3->expression,false);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->arg_order_idx,
               &local_38);
  }
  return;
}

Assistant:

WindowNaiveAggregator::WindowNaiveAggregator(const WindowAggregateExecutor &executor, WindowSharedExpressions &shared)
    : WindowAggregator(executor.wexpr, shared), executor(executor) {

	for (const auto &order : wexpr.arg_orders) {
		arg_order_idx.emplace_back(shared.RegisterCollection(order.expression, false));
	}
}